

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIComboBox.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIComboBox::openCloseMenu(CGUIComboBox *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  IGUIElement *this_00;
  undefined1 auVar3 [16];
  char cVar4;
  uint uVar5;
  long *plVar6;
  IGUIFont *pIVar7;
  int extraout_var;
  CGUIListBox *this_01;
  long lVar8;
  pointer pSVar9;
  IGUIListBox *pIVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  SEvent event;
  
  if (this->ListBox == (IGUIListBox *)0x0) {
    if (*(long **)&this->field_0x20 != (long *)0x0) {
      event.EventType = EET_GUI_EVENT;
      event.field_1.GUIEvent.Element = (IGUIElement *)0x0;
      event.field_1.GUIEvent.EventType = EGET_LISTBOX_OPENED;
      event.field_1.GUIEvent.Caller = (IGUIElement *)this;
      cVar4 = (**(code **)(**(long **)&this->field_0x20 + 0x10))();
      if (cVar4 != '\0') {
        return;
      }
      (**(code **)(**(long **)&this->field_0x20 + 0xd0))(*(long **)&this->field_0x20,this);
    }
    plVar6 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    uVar11 = (int)((ulong)((long)(this->Items).m_data.
                                 super__Vector_base<irr::gui::CGUIComboBox::SComboData,_std::allocator<irr::gui::CGUIComboBox::SComboData>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->Items).m_data.
                                super__Vector_base<irr::gui::CGUIComboBox::SComboData,_std::allocator<irr::gui::CGUIComboBox::SComboData>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    uVar5 = (**(code **)(*(long *)this + 0x180))(this);
    if (uVar5 < uVar11) {
      uVar11 = (**(code **)(*(long *)this + 0x180))(this);
    }
    iVar12 = uVar11 + (uVar11 == 0);
    pIVar7 = (IGUIFont *)(**(code **)(*plVar6 + 0x30))(plVar6,0);
    this->ActiveFont = pIVar7;
    if (pIVar7 != (IGUIFont *)0x0) {
      (*pIVar7->_vptr_IGUIFont[1])(pIVar7,L"A");
      iVar12 = (extraout_var + 4) * iVar12;
    }
    iVar13 = *(int *)&this->field_0x4c - *(int *)&this->field_0x44;
    auVar3._8_4_ = iVar12 + iVar13;
    auVar3._4_4_ = *(int *)&this->field_0x48 - *(int *)&this->field_0x40;
    this_01 = (CGUIListBox *)operator_new(0x1d0);
    auVar3._0_4_ = iVar13;
    auVar3._12_4_ = 0;
    CGUIListBox::CGUIListBox
              (this_01,*(IGUIEnvironment **)&this->field_0x128,(IGUIElement *)this,-1,
               (rect<int>)(auVar3 << 0x20),false,true,true);
    this->ListBox = (IGUIListBox *)this_01;
    (**(code **)(*(long *)this_01 + 0x88))(this_01,1);
    pIVar10 = this->ListBox;
    (pIVar10->super_IGUIElement).NoClip = true;
    (*(pIVar10->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[3])();
    pIVar10 = this->ListBox;
    p_Var2 = (pIVar10->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3];
    p_Var1 = (_func_int *)
             ((long)&(pIVar10->super_IGUIElement).Children.
                     super__List_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>
                     ._M_impl._M_node.super__List_node_base._M_prev + (long)p_Var2);
    *(int *)p_Var1 = *(int *)p_Var1 + -1;
    if (*(int *)p_Var1 == 0) {
      (**(code **)(*(long *)((long)&(pIVar10->super_IGUIElement).super_IEventReceiver.
                                    _vptr_IEventReceiver + (long)p_Var2) + 8))();
      pIVar10 = this->ListBox;
    }
    iVar12 = (pIVar10->super_IGUIElement).AbsoluteRect.LowerRightCorner.Y;
    lVar8 = (**(code **)(**(long **)&this->field_0x128 + 0xb0))();
    if (*(int *)(lVar8 + 0x4c) - *(int *)(lVar8 + 0x44) < iVar12) {
      this_00 = &this->ListBox->super_IGUIElement;
      event._4_4_ = (this_00->AbsoluteRect).UpperLeftCorner.Y -
                    (this_00->AbsoluteRect).LowerRightCorner.Y;
      event.EventType = EET_GUI_EVENT;
      event.field_1.MouseInput.Y = 0;
      event.field_1.MouseInput.X = *(int *)&this->field_0x48 - *(int *)&this->field_0x40;
      IGUIElement::setRelativePosition(this_00,(rect<int> *)&event);
    }
    pSVar9 = (this->Items).m_data.
             super__Vector_base<irr::gui::CGUIComboBox::SComboData,_std::allocator<irr::gui::CGUIComboBox::SComboData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->Items).m_data.
                                super__Vector_base<irr::gui::CGUIComboBox::SComboData,_std::allocator<irr::gui::CGUIComboBox::SComboData>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar9) >> 3) *
            -0x33333333) {
      lVar8 = 0;
      lVar14 = 0;
      do {
        (*(this->ListBox->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x26])
                  (this->ListBox,*(undefined8 *)((long)&(pSVar9->Name).str._M_dataplus._M_p + lVar8)
                  );
        lVar14 = lVar14 + 1;
        pSVar9 = (this->Items).m_data.
                 super__Vector_base<irr::gui::CGUIComboBox::SComboData,_std::allocator<irr::gui::CGUIComboBox::SComboData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x28;
      } while (lVar14 < (int)((ulong)((long)(this->Items).m_data.
                                            super__Vector_base<irr::gui::CGUIComboBox::SComboData,_std::allocator<irr::gui::CGUIComboBox::SComboData>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar9) >> 3) * -0x33333333);
    }
    (*(this->ListBox->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2e])
              (this->ListBox,(ulong)(uint)this->Selected);
    (**(code **)(**(long **)&this->field_0x128 + 8))(*(long **)&this->field_0x128,this->ListBox);
  }
  else {
    (**(code **)(**(long **)&this->field_0x128 + 8))(*(long **)&this->field_0x128,this);
    (*(this->ListBox->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[9])();
    this->ListBox = (IGUIListBox *)0x0;
  }
  return;
}

Assistant:

void CGUIComboBox::openCloseMenu()
{
	if (ListBox) {
		// close list box
		Environment->setFocus(this);
		ListBox->remove();
		ListBox = nullptr;
	} else {
		if (Parent) {
			SEvent event;
			event.EventType = EET_GUI_EVENT;
			event.GUIEvent.Caller = this;
			event.GUIEvent.Element = nullptr;
			event.GUIEvent.EventType = EGET_LISTBOX_OPENED;

			// Allow to prevent the listbox from opening.
			if (Parent->OnEvent(event))
				return;

			Parent->bringToFront(this);
		}

		IGUISkin *skin = Environment->getSkin();
		u32 h = Items.size();

		if (h > getMaxSelectionRows())
			h = getMaxSelectionRows();
		if (h == 0)
			h = 1;

		ActiveFont = skin->getFont();
		if (ActiveFont)
			h *= (ActiveFont->getDimension(L"A").Height + 4);

		// open list box
		core::rect<s32> r(0, AbsoluteRect.getHeight(),
				AbsoluteRect.getWidth(), AbsoluteRect.getHeight() + h);

		ListBox = new CGUIListBox(Environment, this, -1, r, false, true, true);
		ListBox->setSubElement(true);
		ListBox->setNotClipped(true);
		ListBox->drop();

		// ensure that list box is always completely visible
		if (ListBox->getAbsolutePosition().LowerRightCorner.Y > Environment->getRootGUIElement()->getAbsolutePosition().getHeight())
			ListBox->setRelativePosition(core::rect<s32>(0, -ListBox->getAbsolutePosition().getHeight(), AbsoluteRect.getWidth(), 0));

		for (s32 i = 0; i < (s32)Items.size(); ++i)
			ListBox->addItem(Items[i].Name.c_str());

		ListBox->setSelected(Selected);

		// set focus
		Environment->setFocus(ListBox);
	}
}